

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GetObjectConstructor
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          string *data_buffer,string *offset)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  EscapeKeyword(&local_40,this,(string *)struct_def);
  std::operator+(&local_e0,"new ",&local_40);
  std::operator+(&local_c0,&local_e0,"().__assign(");
  std::operator+(&local_a0,&local_c0,offset);
  std::operator+(&local_80,&local_a0,", ");
  std::operator+(&local_60,&local_80,data_buffer);
  std::operator+(__return_storage_ptr__,&local_60,")");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetObjectConstructor(flatbuffers::StructDef &struct_def,
                                   const std::string &data_buffer,
                                   const std::string &offset) const {
    // Use the generated type directly, to properly handle default values that
    // might not be written to the buffer.
    return "new " + Name(struct_def) + "().__assign(" + offset + ", " +
           data_buffer + ")";
  }